

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chipset.c
# Opt level: O0

_Bool pmc_id_flipped(uint32_t pmc_id)

{
  undefined1 local_9;
  uint32_t pmc_id_local;
  
  if ((pmc_id & 0x80000000) == 0) {
    local_9 = false;
  }
  else if ((pmc_id & 0x80) == 0) {
    local_9 = true;
  }
  else {
    local_9 = (pmc_id & 0xf00) != 0;
  }
  return local_9;
}

Assistant:

static bool pmc_id_flipped(uint32_t pmc_id) {
	/*
	 * For determining endianness, there are four cases:
	 *
	 * - pre-NV10 card: always little endian, bits 7 and 31 are guaranteed
	 *   to be 0 (they're high bits of fields that never got big values)
	 * - NV10+ little-endian card: bit 7 is guaranteed to be 1 (MSB of
	 *   stepping, which is always 0xaX or 0xbX), bit 31 is guaranteed
	 *   to be 0
	 * - NV10+ big-endian card: like above, but with byteswapping - bit 7
	 *   is 0, bit 31 is 1
	 * - something is broken with BAR0 access and ID returns 0xffffffff
	 * - both bit 7 and bit 31 are set. This can happen on later cards, so
	 *   in this case we can rely on bits 8-11 to be zero without
	 *   byteswapping
	 */
	if (pmc_id & 0x80000000) {
		if (!(pmc_id & 0x00000080)) /* bit 7 is 0, we're flipped */
			return true;
		else /* bits 31 and 7 are both 1, rely on 8-11 instead */
			return !!(pmc_id & 0x00000F00);
	}
	return false;
}